

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

void NULLC::CollectMemory(void)

{
  clock_t cVar1;
  clock_t cVar2;
  double time;
  
  if ((collectionEnabled & 1) != 0) {
    cVar1 = clock();
    MarkMemory(0);
    GC::MarkUsedBlocks();
    CollectUnmarked();
    cVar2 = clock();
    markTime = ((double)cVar2 / 1000000.0 - (double)cVar1 / 1000000.0) + markTime;
    cVar1 = clock();
    FinalizePending();
    FreePending();
    cVar2 = clock();
    collectTime = ((double)cVar2 / 1000000.0 - (double)cVar1 / 1000000.0) + collectTime;
    if (collectableMinimum <= usedMemory + (usedMemory >> 1)) {
      collectableMinimum = collectableMinimum << 1;
    }
    nullcRunFunction("__finalizeObjects");
    FastVector<NULLCRef,_false,_false>::clear((FastVector<NULLCRef,_false,_false> *)&finalizeList);
  }
  return;
}

Assistant:

void NULLC::CollectMemory()
{
	if(!collectionEnabled)
		return;

	double time = (double(clock()) / CLOCKS_PER_SEC);

	// All memory blocks are marked with 0
	MarkMemory(0);

	// Used memory blocks are marked with 1
	GC::MarkUsedBlocks();

	// Collect sets of objects to finalize and to potentially free
	CollectUnmarked();

	markTime += (double(clock()) / CLOCKS_PER_SEC) - time;
	time = (double(clock()) / CLOCKS_PER_SEC);

	// Ressurect objects and register finalizers
	FinalizePending();

	// Free memory that remains unreachable
	FreePending();

	collectTime += (double(clock()) / CLOCKS_PER_SEC) - time;

	if(usedMemory + (usedMemory >> 1) >= collectableMinimum)
		collectableMinimum <<= 1;

	(void)nullcRunFunction("__finalizeObjects");
	finalizeList.clear();
}